

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O0

void __thiscall
snmalloc::
RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
::insert_path(RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
              *this,RBPath *path,K value)

{
  bool bVar1;
  bool bVar2;
  K KVar3;
  RBPath *this_00;
  ChildRef CVar4;
  RBPath *in_RSI;
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  *in_RDI;
  K child_p;
  K child_g;
  K sibling;
  K grand_parent;
  K parent;
  K curr;
  bool curr_dir;
  RBPath *in_stack_fffffffffffffe58;
  ChildRef in_stack_fffffffffffffe60;
  K in_stack_fffffffffffffe68;
  undefined1 uVar5;
  RBPath *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  *in_stack_fffffffffffffe80;
  
  RBPath::curr(in_stack_fffffffffffffe58);
  ChildRef::operator=((ChildRef *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  RBPath::curr(in_stack_fffffffffffffe58);
  snmalloc::RBTree::ChildRef::operator_cast_to_unsigned_long
            ((ChildRef *)in_stack_fffffffffffffe60.ptr.val);
  get_dir(SUB81(in_stack_fffffffffffffe68 >> 0x38,0),(K)in_stack_fffffffffffffe60.ptr.val);
  ChildRef::operator=((ChildRef *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  RBPath::curr(in_stack_fffffffffffffe58);
  snmalloc::RBTree::ChildRef::operator_cast_to_unsigned_long
            ((ChildRef *)in_stack_fffffffffffffe60.ptr.val);
  get_dir(SUB81(in_stack_fffffffffffffe68 >> 0x38,0),(K)in_stack_fffffffffffffe60.ptr.val);
  ChildRef::operator=((ChildRef *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>
  ::set_red((Contents)in_stack_fffffffffffffe70,SUB81(in_stack_fffffffffffffe68 >> 0x38,0));
  debug_log(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  while( true ) {
    RBPath::curr(in_stack_fffffffffffffe58);
    get_root((RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
              *)in_stack_fffffffffffffe58);
    bVar1 = ChildRef::operator!=((ChildRef *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe60);
    if (!bVar1) {
      get_root((RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
                *)in_stack_fffffffffffffe58);
      uVar5 = (undefined1)(in_stack_fffffffffffffe68 >> 0x38);
      snmalloc::RBTree::ChildRef::operator_cast_to_unsigned_long
                ((ChildRef *)in_stack_fffffffffffffe60.ptr.val);
      BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>
      ::set_red((Contents)in_stack_fffffffffffffe70,(bool)uVar5);
      invariant((RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
                 *)in_stack_fffffffffffffe60.ptr.val);
      return;
    }
    RBPath::parent(in_stack_fffffffffffffe58);
    snmalloc::RBTree::ChildRef::operator_cast_to_unsigned_long
              ((ChildRef *)in_stack_fffffffffffffe60.ptr.val);
    bVar1 = BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>
            ::is_red((Contents)in_stack_fffffffffffffe60.ptr.val);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    bVar1 = RBPath::curr_dir((RBPath *)0x30a2db);
    RBPath::curr(in_stack_fffffffffffffe58);
    KVar3 = snmalloc::RBTree::ChildRef::operator_cast_to_unsigned_long
                      ((ChildRef *)in_stack_fffffffffffffe60.ptr.val);
    RBPath::parent(in_stack_fffffffffffffe58);
    snmalloc::RBTree::ChildRef::operator_cast_to_unsigned_long
              ((ChildRef *)in_stack_fffffffffffffe60.ptr.val);
    RBPath::grand_parent(in_stack_fffffffffffffe58);
    this_00 = (RBPath *)
              snmalloc::RBTree::ChildRef::operator_cast_to_unsigned_long
                        ((ChildRef *)in_stack_fffffffffffffe60.ptr.val);
    bVar2 = RBPath::parent_dir((RBPath *)0x30a36f);
    if (bVar2 == bVar1) {
      CVar4 = RBPath::grand_parent(in_stack_fffffffffffffe58);
      debug_log(in_RDI,"Insert - double red case 1",in_RSI,CVar4);
      get_dir(SUB81(in_stack_fffffffffffffe68 >> 0x38,0),(K)in_stack_fffffffffffffe60.ptr.val);
      snmalloc::RBTree::ChildRef::operator_cast_to_unsigned_long
                ((ChildRef *)in_stack_fffffffffffffe60.ptr.val);
      BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>
      ::set_red((Contents)in_stack_fffffffffffffe70,SUB81(in_stack_fffffffffffffe68 >> 0x38,0));
      get_dir(SUB81(in_stack_fffffffffffffe68 >> 0x38,0),(K)in_stack_fffffffffffffe60.ptr.val);
      ChildRef::operator=((ChildRef *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      get_dir(SUB81(in_stack_fffffffffffffe68 >> 0x38,0),(K)in_stack_fffffffffffffe60.ptr.val);
      ChildRef::operator=((ChildRef *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      RBPath::grand_parent(in_stack_fffffffffffffe58);
      ChildRef::operator=((ChildRef *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      CVar4 = RBPath::grand_parent(in_stack_fffffffffffffe58);
      debug_log(in_RDI,"Insert - double red case 1 - done",in_RSI,CVar4);
    }
    else {
      in_stack_fffffffffffffe60.ptr.val = (H)(H)in_RSI;
      CVar4 = RBPath::grand_parent(in_stack_fffffffffffffe58);
      uVar5 = (undefined1)(in_stack_fffffffffffffe68 >> 0x38);
      debug_log(in_RDI,"Insert - double red case 2",(RBPath *)in_stack_fffffffffffffe60.ptr.val,
                CVar4);
      get_dir((bool)uVar5,(K)in_stack_fffffffffffffe60.ptr.val);
      snmalloc::RBTree::ChildRef::operator_cast_to_unsigned_long
                ((ChildRef *)in_stack_fffffffffffffe60.ptr.val);
      get_dir((bool)uVar5,(K)in_stack_fffffffffffffe60.ptr.val);
      snmalloc::RBTree::ChildRef::operator_cast_to_unsigned_long
                ((ChildRef *)in_stack_fffffffffffffe60.ptr.val);
      BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>
      ::set_red((Contents)in_stack_fffffffffffffe70,(bool)uVar5);
      RBPath::grand_parent(in_stack_fffffffffffffe58);
      ChildRef::operator=((ChildRef *)in_stack_fffffffffffffe70,KVar3);
      get_dir(SUB81(KVar3 >> 0x38,0),(K)in_stack_fffffffffffffe60.ptr.val);
      ChildRef::operator=((ChildRef *)this_00,KVar3);
      get_dir(SUB81(KVar3 >> 0x38,0),(K)in_stack_fffffffffffffe60.ptr.val);
      ChildRef::operator=((ChildRef *)this_00,KVar3);
      get_dir(SUB81(KVar3 >> 0x38,0),(K)in_stack_fffffffffffffe60.ptr.val);
      ChildRef::operator=((ChildRef *)this_00,KVar3);
      get_dir(SUB81(KVar3 >> 0x38,0),(K)in_stack_fffffffffffffe60.ptr.val);
      ChildRef::operator=((ChildRef *)this_00,KVar3);
      CVar4 = RBPath::grand_parent(in_stack_fffffffffffffe58);
      debug_log(in_RDI,"Insert - double red case 2 - done",in_RSI,CVar4);
      in_stack_fffffffffffffe68 = KVar3;
      in_stack_fffffffffffffe70 = this_00;
    }
    RBPath::pop(in_RSI);
    RBPath::pop(in_RSI);
    RBPath::curr(in_stack_fffffffffffffe58);
    KVar3 = snmalloc::RBTree::ChildRef::operator_cast_to_unsigned_long
                      ((ChildRef *)in_stack_fffffffffffffe60.ptr.val);
    invariant(in_RDI,KVar3,0,0);
  }
  invariant((RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
             *)in_stack_fffffffffffffe60.ptr.val);
  return;
}

Assistant:

void insert_path(RBPath& path, K value)
    {
      SNMALLOC_ASSERT(path.curr().is_null());
      path.curr() = value;
      get_dir(true, path.curr()) = Rep::null;
      get_dir(false, path.curr()) = Rep::null;
      Rep::set_red(value, true);

      debug_log("Insert ", path);

      // Propogate double red up to rebalance.
      // These notes were particularly clear for explaining insert
      // https://www.cs.cmu.edu/~fp/courses/15122-f10/lectures/17-rbtrees.pdf
      while (path.curr() != get_root())
      {
        SNMALLOC_ASSERT(Rep::is_red(path.curr()));
        if (!Rep::is_red(path.parent()))
        {
          invariant();
          return;
        }
        bool curr_dir = path.curr_dir();
        K curr = path.curr();
        K parent = path.parent();
        K grand_parent = path.grand_parent();
        SNMALLOC_ASSERT(!Rep::is_red(grand_parent));
        if (path.parent_dir() == curr_dir)
        {
          debug_log("Insert - double red case 1", path, path.grand_parent());
          /* Same direction case
           * G - grand parent
           * P - parent
           * C - current
           * S - sibling
           *
           *    G                 P
           *   / \               / \
           *  A   P     -->     G   C
           *     / \           / \
           *    S   C         A   S
           */
          K sibling = get_dir(!curr_dir, parent);
          Rep::set_red(curr, false);
          get_dir(curr_dir, grand_parent) = sibling;
          get_dir(!curr_dir, parent) = grand_parent;
          path.grand_parent() = parent;
          debug_log(
            "Insert - double red case 1 - done", path, path.grand_parent());
        }
        else
        {
          debug_log("Insert - double red case 2", path, path.grand_parent());
          /* G - grand parent
           * P - parent
           * C - current
           * Cg - Current child for grand parent
           * Cp - Current child for parent
           *
           *    G                  C
           *   / \               /   \
           *  A   P             G     P
           *     / \    -->    / \   / \
           *    C   B         A  Cg Cp  B
           *   / \
           *  Cg  Cp
           */
          K child_g = get_dir(curr_dir, curr);
          K child_p = get_dir(!curr_dir, curr);

          Rep::set_red(parent, false);
          path.grand_parent() = curr;
          get_dir(curr_dir, curr) = grand_parent;
          get_dir(!curr_dir, curr) = parent;
          get_dir(curr_dir, parent) = child_p;
          get_dir(!curr_dir, grand_parent) = child_g;
          debug_log(
            "Insert - double red case 2 - done", path, path.grand_parent());
        }

        // Move to what replaced grand parent.
        path.pop();
        path.pop();
        invariant(path.curr());
      }
      Rep::set_red(get_root(), false);
      invariant();
    }